

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_eval_bl(TCGContext_conflict7 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src)

{
  TCGTemp *a1;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_4;
  TCGv_i32 ret;
  
  a1 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)tcg_ctx);
  if (ret != src) {
    tcg_gen_op2_sparc(tcg_ctx,INDEX_op_mov_i32,(TCGArg)a1,(TCGArg)(src + (long)&tcg_ctx->pool_cur));
  }
  tcg_gen_extract_i32_sparc(tcg_ctx,ret,ret,0x15,1);
  if (dst != src) {
    tcg_gen_op2_sparc(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(dst + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(src + (long)tcg_ctx));
  }
  tcg_gen_extract_i32_sparc(tcg_ctx,dst,dst,0x17,1);
  tcg_gen_op3_sparc(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(dst + (long)tcg_ctx),
                    (TCGArg)(dst + (long)tcg_ctx),(TCGArg)a1);
  tcg_temp_free_internal_sparc(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_op_eval_bl(TCGContext *tcg_ctx, TCGv dst, TCGv_i32 src)
{
    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_mov_reg_V(tcg_ctx, t0, src);
    gen_mov_reg_N(tcg_ctx, dst, src);
    tcg_gen_xor_tl(tcg_ctx, dst, dst, t0);
    tcg_temp_free(tcg_ctx, t0);
}